

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLenum GVar2;
  deBool dVar3;
  uint uVar4;
  RenderTarget *this_00;
  PixelFormat *pPVar5;
  QuadRenderer *this_01;
  RenderContext *context;
  ReferenceQuadRenderer *this_02;
  TextureLevel *this_03;
  TestLog *this_04;
  MessageBuilder *pMVar6;
  Vec4 *pVVar8;
  Vec4 *pVVar9;
  ChannelOrder local_28c;
  bool local_251;
  MessageBuilder local_250;
  TextureFormat local_d0;
  Vector<int,_2> local_c8;
  Vector<int,_2> local_c0;
  Vector<int,_2> local_b8;
  Vector<int,_2> local_b0;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  undefined8 local_68;
  undefined8 local_60;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  int i;
  bool local_11;
  BlendCase *pBStack_10;
  bool useRGB;
  BlendCase *this_local;
  BlendCase *pBVar7;
  
  local_251 = false;
  pBStack_10 = this;
  if ((this->m_useSrgbFbo & 1U) == 0) {
    this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar5 = tcu::RenderTarget::getPixelFormat(this_00);
    local_251 = pPVar5->alphaBits == 0;
  }
  local_11 = local_251;
  if ((init()::baseGradientColors == '\0') &&
     (iVar1 = __cxa_guard_acquire(&init()::baseGradientColors), iVar1 != 0)) {
    tcu::Vector<float,_4>::Vector(init::baseGradientColors,0.0,0.5,1.0,0.5);
    tcu::Vector<float,_4>::Vector(init::baseGradientColors + 1,0.5,0.0,0.5,1.0);
    tcu::Vector<float,_4>::Vector(init::baseGradientColors + 2,0.5,1.0,0.5,0.0);
    tcu::Vector<float,_4>::Vector(init::baseGradientColors + 3,1.0,0.5,0.0,0.5);
    __cxa_guard_release(&init()::baseGradientColors);
  }
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    tcu::operator-((tcu *)&local_58,init::baseGradientColors + local_28,0.5);
    tcu::operator*((tcu *)&local_48,&local_58,0.2);
    tcu::operator+((tcu *)&local_38,&local_48,0.5);
    pVVar8 = (this->m_firstQuad).color + local_28;
    *(undefined8 *)pVVar8->m_data = local_38;
    *(undefined8 *)(pVVar8->m_data + 2) = local_30;
    pVVar9 = (this->m_firstQuad).color + local_28;
    pVVar8 = (this->m_firstQuadInt).color + local_28;
    *(undefined8 *)pVVar8->m_data = *(undefined8 *)pVVar9->m_data;
    *(undefined8 *)(pVVar8->m_data + 2) = *(undefined8 *)(pVVar9->m_data + 2);
    tcu::Vector<float,_4>::Vector(&local_a8,1.0);
    tcu::operator-((tcu *)&local_98,&local_a8,init::baseGradientColors + local_28);
    tcu::operator-((tcu *)&local_88,&local_98,0.5);
    tcu::operator*((tcu *)&local_78,&local_88,1.0);
    tcu::operator+((tcu *)&local_68,&local_78,0.5);
    pVVar8 = (this->m_secondQuad).color + local_28;
    *(undefined8 *)pVVar8->m_data = local_68;
    *(undefined8 *)(pVVar8->m_data + 2) = local_60;
    pVVar9 = (this->m_secondQuad).color + local_28;
    pVVar8 = (this->m_secondQuadInt).color + local_28;
    *(undefined8 *)pVVar8->m_data = *(undefined8 *)pVVar9->m_data;
    *(undefined8 *)(pVVar8->m_data + 2) = *(undefined8 *)(pVVar9->m_data + 2);
  }
  iVar1 = de::min<int>(this->m_renderWidth,0x40);
  this->m_viewportWidth = iVar1;
  iVar1 = de::min<int>(this->m_renderHeight,0x40);
  this->m_viewportHeight = iVar1;
  tcu::Vector<int,_2>::Vector(&local_b0,0,0);
  *&(this->m_firstQuadInt).posA.m_data = local_b0.m_data;
  tcu::Vector<int,_2>::Vector(&local_b8,0,0);
  *&(this->m_secondQuadInt).posA.m_data = local_b8.m_data;
  tcu::Vector<int,_2>::Vector(&local_c0,this->m_viewportWidth + -1,this->m_viewportHeight + -1);
  *&(this->m_firstQuadInt).posB.m_data = local_c0.m_data;
  tcu::Vector<int,_2>::Vector(&local_c8,this->m_viewportWidth + -1,this->m_viewportHeight + -1);
  *&(this->m_secondQuadInt).posB.m_data = local_c8.m_data;
  this_01 = (QuadRenderer *)operator_new(0x20);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer(this_01,context,GLSL_VERSION_300_ES);
  this->m_renderer = this_01;
  this_02 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_02);
  this->m_referenceRenderer = this_02;
  this_03 = (TextureLevel *)operator_new(0x28);
  if ((this->m_useSrgbFbo & 1U) == 0) {
    local_28c = RGBA;
    if ((local_11 & 1U) != 0) {
      local_28c = RGB;
    }
  }
  else {
    local_28c = sRGBA;
  }
  tcu::TextureFormat::TextureFormat(&local_d0,local_28c,UNORM_INT8);
  tcu::TextureLevel::TextureLevel(this_03,&local_d0,this->m_viewportWidth,this->m_viewportHeight,1);
  this->m_refColorBuffer = this_03;
  this->m_curParamSetNdx = 0;
  pBVar7 = this;
  if ((this->m_useSrgbFbo & 1U) != 0) {
    this_04 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_250,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_250,(char (*) [20])"Using FBO of size (");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_renderWidth);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x12ed2ef);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_renderHeight);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [30])") with format GL_SRGB8_ALPHA8");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_250);
    do {
      glwGenRenderbuffers(1,&this->m_colorRbo);
      GVar2 = glwGetError();
      glu::checkError(GVar2,"glGenRenderbuffers(1, &m_colorRbo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                      ,0xd8);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      glwBindRenderbuffer(0x8d41,this->m_colorRbo);
      GVar2 = glwGetError();
      glu::checkError(GVar2,"glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                      ,0xd9);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      glwRenderbufferStorage(0x8d41,0x8c43,this->m_renderWidth,this->m_renderHeight);
      GVar2 = glwGetError();
      glu::checkError(GVar2,
                      "glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                      ,0xda);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      glwGenFramebuffers(1,&this->m_fbo);
      GVar2 = glwGetError();
      glu::checkError(GVar2,"glGenFramebuffers(1, &m_fbo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                      ,0xdc);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      glwBindFramebuffer(0x8d40,this->m_fbo);
      GVar2 = glwGetError();
      glu::checkError(GVar2,"glBindFramebuffer(GL_FRAMEBUFFER, m_fbo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                      ,0xdd);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      glwFramebufferRenderbuffer(0x8d40,0x8ce0,0x8d41,this->m_colorRbo);
      GVar2 = glwGetError();
      glu::checkError(GVar2,
                      "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                      ,0xde);
      uVar4 = ::deGetFalse();
      pBVar7 = (BlendCase *)(ulong)uVar4;
    } while (uVar4 != 0);
  }
  return (int)pBVar7;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = !m_useSrgbFbo && m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportWidth		= de::min<int>(m_renderWidth,	MAX_VIEWPORT_WIDTH);
	m_viewportHeight	= de::min<int>(m_renderHeight,	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,						0);
	m_secondQuadInt.posA	= tcu::IVec2(0,						0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_300_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(m_useSrgbFbo ? TextureFormat::sRGBA : useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportWidth, m_viewportHeight);

	m_curParamSetNdx = 0;

	if (m_useSrgbFbo)
	{
		m_testCtx.getLog() << TestLog::Message << "Using FBO of size (" << m_renderWidth << ", " << m_renderHeight << ") with format GL_SRGB8_ALPHA8" << TestLog::EndMessage;

		GLU_CHECK_CALL(glGenRenderbuffers(1, &m_colorRbo));
		GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo));
		GLU_CHECK_CALL(glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight));

		GLU_CHECK_CALL(glGenFramebuffers(1, &m_fbo));
		GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, m_fbo));
		GLU_CHECK_CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo));
	}
}